

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void cfgfile::generator::generate_fields_in_ctor(ostream *stream,const_class_ptr_t c)

{
  pointer pfVar1;
  min_max_constraint_t *this;
  bool bVar2;
  int iVar3;
  vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  *pvVar4;
  ostream *poVar5;
  string *psVar6;
  undefined4 *puVar7;
  shared_ptr<cfgfile::generator::cfg::constraint_base_t> *psVar8;
  pointer this_00;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  char *local_70;
  long local_68;
  undefined4 local_60;
  undefined1 auStack_5c [12];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pvVar4 = cfg::class_t::fields(c);
  this_00 = (pvVar4->
            super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pfVar1 = (pvVar4->
           super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pfVar1) {
    do {
      bVar2 = cfg::field_t::is_base(this_00);
      if (!bVar2) {
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\t\t,\tm_","");
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)local_b0,local_a8);
        psVar6 = cfg::field_t::name_abi_cxx11_(this_00);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"( *this, Trait::from_ascii( \"","");
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_d0,local_c8);
        psVar6 = cfg::field_t::name_abi_cxx11_(this_00);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\" ), ","");
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_90,local_88);
        bVar2 = cfg::field_t::is_required(this_00);
        if (bVar2) {
          local_60 = 0x65757274;
          local_68 = 4;
          puVar7 = (undefined4 *)auStack_5c;
        }
        else {
          auStack_5c[0] = 0x65;
          local_60 = 0x736c6166;
          local_68 = 5;
          puVar7 = (undefined4 *)((long)auStack_5c + 1);
        }
        *(undefined1 *)puVar7 = 0;
        local_70 = (char *)&local_60;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)&local_60,local_68);
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," )\n","");
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_50,local_48);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (local_70 != (char *)&local_60) {
          operator_delete(local_70,CONCAT44(auStack_5c._0_4_,local_60) + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (local_d0 != local_c0) {
          operator_delete(local_d0,local_c0[0] + 1);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,local_a0[0] + 1);
        }
        bVar2 = cfg::field_t::is_constraint_null(this_00);
        if (!bVar2) {
          psVar8 = cfg::field_t::constraint(this_00);
          this = (min_max_constraint_t *)
                 (psVar8->
                 super___shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
          iVar3 = (*(this->super_constraint_base_t)._vptr_constraint_base_t[2])(this);
          if (iVar3 == 1) {
            local_b0 = local_a0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\t\t,\tm_","");
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (stream,(char *)local_b0,local_a8);
            psVar6 = cfg::field_t::name_abi_cxx11_(this_00);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
            local_d0 = local_c0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"_constraint( ","");
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)local_d0,local_c8);
            psVar6 = cfg::min_max_constraint_t::min_abi_cxx11_(this);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
            local_90 = local_80;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,", ","");
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)local_90,local_88);
            psVar6 = cfg::min_max_constraint_t::max_abi_cxx11_(this);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
            local_70 = (char *)&local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70," )\n","");
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_70,local_68);
            if (local_70 != (char *)&local_60) {
              operator_delete(local_70,CONCAT44(auStack_5c._0_4_,local_60) + 1);
            }
            if (local_90 != local_80) {
              operator_delete(local_90,local_80[0] + 1);
            }
          }
          else {
            if (iVar3 != 2) goto LAB_0011c5b0;
            local_b0 = local_a0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\t\t,\tm_","");
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (stream,(char *)local_b0,local_a8);
            psVar6 = cfg::field_t::name_abi_cxx11_(this_00);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
            local_d0 = local_c0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"_constraint()\n","");
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_d0,local_c8);
          }
          if (local_d0 != local_c0) {
            operator_delete(local_d0,local_c0[0] + 1);
          }
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
        }
      }
LAB_0011c5b0:
      this_00 = this_00 + 1;
    } while (this_00 != pfVar1);
  }
  return;
}

Assistant:

static inline void generate_fields_in_ctor( std::ostream & stream,
	cfg::const_class_ptr_t c )
{
	for( const cfg::field_t & f : c->fields() )
	{
		if( !f.is_base() )
		{
			stream << std::string( "\t\t,\tm_" )
				<< f.name() << std::string( "( *this, Trait::from_ascii( \"" )
				<< f.name() << std::string( "\" ), " )
				<< bool_to_string( f.is_required() )
				<< std::string( " )\n" );

			if( !f.is_constraint_null() )
			{
				cfg::constraint_base_t * constr = f.constraint().get();

				switch( constr->type() )
				{
					case cfg::constraint_base_t::min_max_constraint_type :
					{
						cfg::min_max_constraint_t * min_max =
							static_cast< cfg::min_max_constraint_t* > ( constr );

						stream << std::string( "\t\t,\tm_" )
							<< f.name() << std::string( "_constraint( " )
							<< min_max->min() << std::string( ", " )
							<< min_max->max() << std::string( " )\n" );
					}
						break;

					case cfg::constraint_base_t::one_of_constraint_type :
					{
						stream << std::string( "\t\t,\tm_" )
							<< f.name() << std::string( "_constraint()\n" );
					}
						break;

					default :
						break;
				}
			}
		}
	}
}